

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_math_stroke.h
# Opt level: O2

void __thiscall
agg::math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_>::calc_join
          (math_stroke<agg::pod_bvector<agg::point_base<double>,_6U>_> *this,
          pod_bvector<agg::point_base<double>,_6U> *vc,vertex_dist *v0,vertex_dist *v1,
          vertex_dist *v2,double len1,double len2)

{
  double dVar1;
  double dVar2;
  double dVar3;
  inner_join_e iVar4;
  line_join_e lj;
  bool bVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dx1;
  double dy1;
  double dy;
  double dx;
  double local_38;
  undefined8 uStack_30;
  
  dVar6 = this->m_width;
  dVar9 = v1->x;
  dVar10 = v1->y;
  dVar7 = v0->x;
  dVar1 = v0->y;
  dVar8 = dVar10 - dVar1;
  dVar11 = dVar9 - dVar7;
  dVar2 = v2->x;
  dVar3 = v2->y;
  dVar12 = dVar3 - dVar10;
  dVar13 = dVar2 - dVar9;
  vc->m_size = 0;
  dVar14 = dVar13 * dVar8 - dVar12 * dVar11;
  dx1 = (dVar6 * dVar8) / len1;
  dy1 = (dVar6 * dVar11) / len1;
  dVar11 = (dVar6 * dVar12) / len2;
  dVar8 = (dVar6 * dVar13) / len2;
  if (((dVar14 != 0.0) || (NAN(dVar14))) && (dVar6 <= 0.0 != 0.0 < dVar14)) {
    dVar6 = len1;
    if (len2 <= len1) {
      dVar6 = len2;
    }
    dVar6 = dVar6 / this->m_width_abs;
    dVar7 = this->m_inner_miter_limit;
    if (this->m_inner_miter_limit <= dVar6) {
      dVar7 = dVar6;
    }
    iVar4 = this->m_inner_join;
    if (iVar4 - inner_jag < 2) {
      dVar6 = (dx1 - dVar11) * (dx1 - dVar11) + (dy1 - dVar8) * (dy1 - dVar8);
      if ((dVar6 < len1 * len1) && (dVar6 < len2 * len2)) {
LAB_001151f6:
        calc_miter(this,vc,v0,v1,v2,dx1,dy1,dVar11,dVar8,miter_join_revert,dVar7,0.0);
        return;
      }
      uStack_30 = 0;
      local_38 = dy1;
      add_vertex(this,vc,dVar9 + dx1,dVar10 - dy1);
      add_vertex(this,vc,v1->x,v1->y);
      dVar6 = v1->x;
      if (iVar4 == inner_jag) {
        dVar7 = v1->y;
        goto LAB_0011536e;
      }
      calc_arc(this,vc,dVar6,v1->y,dVar11,-dVar8,dx1,-local_38);
      dVar9 = v1->x;
      dVar10 = v1->y;
    }
    else {
      if (iVar4 == inner_miter) goto LAB_001151f6;
      dVar9 = dVar9 + dx1;
      dVar10 = dVar10 - dy1;
    }
    add_vertex(this,vc,dVar9,dVar10);
    dVar6 = v1->x;
    dVar7 = v1->y;
LAB_0011536e:
    add_vertex(this,vc,dVar11 + dVar6,dVar7 - dVar8);
    return;
  }
  dx = (dx1 + dVar11) * 0.5;
  dy = (dy1 + dVar8) * 0.5;
  dVar6 = SQRT(dx * dx + dy * dy);
  lj = this->m_line_join;
  if (((lj & ~miter_join_revert) != round_join) ||
     (this->m_width_eps <= (this->m_width_abs - dVar6) * this->m_approx_scale)) {
    if (miter_join_revert < lj) {
      if (lj == round_join) {
        calc_arc(this,vc,dVar9,dVar10,dx1,-dy1,dVar11,-dVar8);
        return;
      }
      if (lj != miter_join_round) {
        add_vertex(this,vc,dx1 + dVar9,dVar10 - dy1);
        dVar6 = dVar11 + v1->x;
        dVar7 = v1->y - dVar8;
        goto LAB_001152c1;
      }
    }
    calc_miter(this,vc,v0,v1,v2,dx1,dy1,dVar11,dVar8,lj,this->m_miter_limit,dVar6);
  }
  else {
    uStack_30 = 0;
    local_38 = dy1;
    bVar5 = calc_intersection(dVar7 + dx1,dVar1 - dy1,dx1 + dVar9,dVar10 - dy1,dVar9 + dVar11,
                              dVar10 - dVar8,dVar2 + dVar11,dVar3 - dVar8,&dx,&dy);
    dVar6 = dx;
    dVar7 = dy;
    if (!bVar5) {
      dVar6 = dx1 + v1->x;
      dVar7 = v1->y - local_38;
    }
LAB_001152c1:
    add_vertex(this,vc,dVar6,dVar7);
  }
  return;
}

Assistant:

void math_stroke<VC>::calc_join(VC& vc,
                                    const vertex_dist& v0, 
                                    const vertex_dist& v1, 
                                    const vertex_dist& v2,
                                    double len1, 
                                    double len2)
    {
        double dx1 = m_width * (v1.y - v0.y) / len1;
        double dy1 = m_width * (v1.x - v0.x) / len1;
        double dx2 = m_width * (v2.y - v1.y) / len2;
        double dy2 = m_width * (v2.x - v1.x) / len2;

        vc.remove_all();

        double cp = cross_product(v0.x, v0.y, v1.x, v1.y, v2.x, v2.y);
        if(cp != 0 && (cp > 0) == (m_width > 0))
        {
            // Inner join
            //---------------
            double limit = ((len1 < len2) ? len1 : len2) / m_width_abs;
            if(limit < m_inner_miter_limit)
            {
                limit = m_inner_miter_limit;
            }

            switch(m_inner_join)
            {
            default: // inner_bevel
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                add_vertex(vc, v1.x + dx2, v1.y - dy2);
                break;

            case inner_miter:
                calc_miter(vc,
                           v0, v1, v2, dx1, dy1, dx2, dy2, 
                           miter_join_revert, 
                           limit, 0);
                break;

            case inner_jag:
            case inner_round:
                cp = (dx1-dx2) * (dx1-dx2) + (dy1-dy2) * (dy1-dy2);
                if(cp < len1 * len1 && cp < len2 * len2)
                {
                    calc_miter(vc,
                               v0, v1, v2, dx1, dy1, dx2, dy2, 
                               miter_join_revert, 
                               limit, 0);
                }
                else
                {
                    if(m_inner_join == inner_jag)
                    {
                        add_vertex(vc, v1.x + dx1, v1.y - dy1);
                        add_vertex(vc, v1.x,       v1.y      );
                        add_vertex(vc, v1.x + dx2, v1.y - dy2);
                    }
                    else
                    {
                        add_vertex(vc, v1.x + dx1, v1.y - dy1);
                        add_vertex(vc, v1.x,       v1.y      );
                        calc_arc(vc, v1.x, v1.y, dx2, -dy2, dx1, -dy1);
                        add_vertex(vc, v1.x,       v1.y      );
                        add_vertex(vc, v1.x + dx2, v1.y - dy2);
                    }
                }
                break;
            }
        }
        else
        {
            // Outer join
            //---------------

            // Calculate the distance between v1 and 
            // the central point of the bevel line segment
            //---------------
            double dx = (dx1 + dx2) / 2;
            double dy = (dy1 + dy2) / 2;
            double dbevel = sqrt(dx * dx + dy * dy);

            if(m_line_join == round_join || m_line_join == bevel_join)
            {
                // This is an optimization that reduces the number of points 
                // in cases of almost collinear segments. If there's no
                // visible difference between bevel and miter joins we'd rather
                // use miter join because it adds only one point instead of two. 
                //
                // Here we calculate the middle point between the bevel points 
                // and then, the distance between v1 and this middle point. 
                // At outer joins this distance always less than stroke width, 
                // because it's actually the height of an isosceles triangle of
                // v1 and its two bevel points. If the difference between this
                // width and this value is small (no visible bevel) we can 
                // add just one point. 
                //
                // The constant in the expression makes the result approximately 
                // the same as in round joins and caps. You can safely comment 
                // out this entire "if".
                //-------------------
                if(m_approx_scale * (m_width_abs - dbevel) < m_width_eps)
                {
                    if(calc_intersection(v0.x + dx1, v0.y - dy1,
                                         v1.x + dx1, v1.y - dy1,
                                         v1.x + dx2, v1.y - dy2,
                                         v2.x + dx2, v2.y - dy2,
                                         &dx, &dy))
                    {
                        add_vertex(vc, dx, dy);
                    }
                    else
                    {
                        add_vertex(vc, v1.x + dx1, v1.y - dy1);
                    }
                    return;
                }
            }

            switch(m_line_join)
            {
            case miter_join:
            case miter_join_revert:
            case miter_join_round:
                calc_miter(vc, 
                           v0, v1, v2, dx1, dy1, dx2, dy2, 
                           m_line_join, 
                           m_miter_limit,
                           dbevel);
                break;

            case round_join:
                calc_arc(vc, v1.x, v1.y, dx1, -dy1, dx2, -dy2);
                break;

            default: // Bevel join
                add_vertex(vc, v1.x + dx1, v1.y - dy1);
                add_vertex(vc, v1.x + dx2, v1.y - dy2);
                break;
            }
        }
    }